

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

void __thiscall tonk::gateway::HTTPRequester::ContinueReadingBody(HTTPRequester *this)

{
  streambuf *psVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  uint bytes;
  Result success;
  istream is;
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
  local_188;
  error_code local_158;
  long local_148 [2];
  ios_base local_138 [264];
  
  if (this->Done == false) {
    psVar1 = &this->TCPStreamBuf;
    std::istream::istream((istream *)local_148,&psVar1->super_streambuf);
    do {
      lVar4 = *(long *)&(this->TCPStreamBuf).field_0x18 - *(long *)&(this->TCPStreamBuf).field_0x10;
      if (lVar4 == 0) {
        lVar4 = (**(code **)(*(long *)psVar1 + 0x38))(psVar1);
      }
      if (lVar4 < 1) break;
      puVar2 = (this->BodyContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (this->BodyContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)&(this->TCPStreamBuf).field_0x18 - *(long *)&(this->TCPStreamBuf).field_0x10;
      if (lVar4 == 0) {
        lVar4 = (**(code **)(*(long *)psVar1 + 0x38))(psVar1);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->BodyContent,(size_type)(puVar2 + (lVar4 - (long)puVar3)));
      std::istream::read((char *)local_148,
                         (long)(puVar2 + ((long)(this->BodyContent).
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start -
                                         (long)puVar3)));
    } while ((ulong)((long)(this->BodyContent).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->BodyContent).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start) < this->ContentLength);
    puVar2 = (this->BodyContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->BodyContent).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
    bytes = (uint)this->ContentLength;
    if (uVar5 < this->ContentLength) {
      local_188.super_base_from_completion_cond<asio::detail::transfer_exactly_t>.
      completion_condition_.size_._0_4_ = bytes - (int)uVar5;
      local_188.super_base_from_completion_cond<asio::detail::transfer_exactly_t>.
      completion_condition_.size_._4_4_ = 0;
      this->AsyncRefs = this->AsyncRefs + 1;
      local_188.stream_ =
           (this->Socket_TCP)._M_t.
           super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
           ._M_head_impl;
      local_188.start_ = 0;
      local_188.total_transferred_ = 0;
      local_158._M_value = 0;
      local_188.buffers_.sb_ = psVar1;
      local_188.handler_.this = this;
      local_158._M_cat = (error_category *)std::_V2::system_category();
      asio::detail::
      read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
      ::operator()(&local_188,&local_158,0,1);
    }
    else {
      local_188.super_base_from_completion_cond<asio::detail::transfer_exactly_t>.
      completion_condition_.size_ = (transfer_exactly_t)0;
      OnDone(this,(Result *)&local_188,this->HTTPStatusCode,(char *)puVar2,bytes);
      Result::~Result((Result *)&local_188);
    }
    local_148[0] = _VTT;
    *(undefined8 *)((long)local_148 + *(long *)(_VTT + -0x18)) = _pthread_setaffinity_np;
    local_148[1] = 0;
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void HTTPRequester::ContinueReadingBody()
{
    if (Done) {
        return;
    }

    std::istream is(&TCPStreamBuf);

    while (TCPStreamBuf.in_avail() > 0)
    {
        // Append bytes from the multiple buffers backing TCPStreamBuf
        // into the single contiguous buffer of body content we will return
        const size_t priorBytes = BodyContent.size();
        const size_t availBytes = (size_t)TCPStreamBuf.in_avail();
        BodyContent.resize(priorBytes + availBytes);
        is.read((char*)BodyContent.data() + priorBytes, availBytes);

        // If we are done:
        if (ContentLength <= BodyContent.size()) {
            break;
        }
    }

    // If we are done:
    if (ContentLength <= BodyContent.size())
    {
        const Result success = Result::Success();
        OnDone(success, HTTPStatusCode, (char*)BodyContent.data(), (unsigned)ContentLength);
        return;
    }

    // Read enough to fill the BodyContent buffer
    unsigned readCount = static_cast<unsigned>(ContentLength - BodyContent.size());

    // Request to read exactly the amount left in the body
    ++AsyncRefs;
    asio::async_read(
        *Socket_TCP,
        TCPStreamBuf,
        asio::transfer_exactly(readCount),
        [this](const asio::error_code& ec, size_t bytes)
    {
        --AsyncRefs;

        // If the socket was closed:
        if (bytes <= 0 || ec)
        {
            Result result = Result("Connection closed", ec.message(), ErrorType::Asio, ec.value());
            OnDone(result);
            return;
        }

        ContinueReadingBody();
    });
}